

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad.c
# Opt level: O0

int addidentity1(int i)

{
  bool bVar1;
  symboltype sVar2;
  float fVar3;
  int i_local;
  
  bVar1 = false;
  if (intcode[i].opcode == opadd) {
    sVar2 = symclass(intcode[i].op2.opnd);
    bVar1 = false;
    if (sVar2 == stliteral) {
      fVar3 = getvalue(intcode[i].op2.opnd);
      bVar1 = fVar3 == 0.0;
    }
  }
  return (uint)bVar1;
}

Assistant:

int	addidentity1(int i)
{
    return((intcode[i].opcode == opadd
            && symclass(intcode[i].op2.opnd) == stliteral
            && getvalue(intcode[i].op2.opnd) == 0)? TRUE
           : FALSE);
}